

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O1

Result_Type
chaiscript::detail::Cast_Helper_Inner<const_char_&>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Result_Type pcVar2;
  bad_any_cast *this;
  
  bVar1 = Type_Info::bare_equal_type_info
                    (&((ob->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(type_info *)&char::typeinfo);
  if (bVar1) {
    pcVar2 = (Result_Type)
             throw_if_null<void_const>
                       (((ob->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_const_data_ptr);
    return pcVar2;
  }
  this = (bad_any_cast *)__cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(this);
  __cxa_throw(this,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            auto p = throw_if_null(ob.get_const_ptr());
            return *static_cast<const Result *>(p);
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }